

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# userobject.cpp
# Opt level: O1

UserObject * __thiscall camp::UserObject::operator=(UserObject *this,UserObject *other)

{
  ParentObject *pPVar1;
  UserProperty *pUVar2;
  ParentObject *this_00;
  scoped_ptr<camp::ParentObject> parent;
  scoped_ptr<camp::ParentObject> local_30;
  
  pPVar1 = (other->m_parent).px;
  if (pPVar1 == (ParentObject *)0x0) {
    this_00 = (ParentObject *)0x0;
  }
  else {
    this_00 = (ParentObject *)operator_new(0x58);
    pUVar2 = pPVar1->member;
    UserObject((UserObject *)this_00,&pPVar1->object);
    this_00->member = pUVar2;
    UserObject(&this_00->lastValue);
  }
  this->m_class = other->m_class;
  (this->m_holder).
  super___shared_ptr<camp::detail::AbstractObjectHolder,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (other->m_holder).
       super___shared_ptr<camp::detail::AbstractObjectHolder,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_30.px = this_00;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->m_holder).
              super___shared_ptr<camp::detail::AbstractObjectHolder,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,
             &(other->m_holder).
              super___shared_ptr<camp::detail::AbstractObjectHolder,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  pPVar1 = (this->m_parent).px;
  (this->m_parent).px = local_30.px;
  this->m_child = (UserObject *)0x0;
  if (local_30.px != (ParentObject *)0x0) {
    ((local_30.px)->object).m_child = this;
  }
  local_30.px = pPVar1;
  boost::scoped_ptr<camp::ParentObject>::~scoped_ptr(&local_30);
  return this;
}

Assistant:

UserObject& UserObject::operator=(const UserObject& other)
{
    boost::scoped_ptr<ParentObject> parent(other.m_parent ? new ParentObject(other.m_parent->object, other.m_parent->member) : 0);

    m_class = other.m_class;
    m_holder = other.m_holder;
    m_parent.swap(parent);
    m_child = 0;

    if (m_parent)
        m_parent->object.m_child = this;

    return *this;
}